

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_nls.c
# Opt level: O2

int idaNlsLSetup(int jbad,int *jcur,void *ida_mem)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0xf4,"idaNlsLSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_nls.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *(long *)((long)ida_mem + 0x390) = *(long *)((long)ida_mem + 0x390) + 1;
    iVar1 = (**(code **)((long)ida_mem + 0x3f8))
                      (ida_mem,*(undefined8 *)((long)ida_mem + 0x188),
                       *(undefined8 *)((long)ida_mem + 400),*(undefined8 *)((long)ida_mem + 0x1c0),
                       *(undefined8 *)((long)ida_mem + 0x1d0),*(undefined8 *)((long)ida_mem + 0x1d8)
                       ,*(undefined8 *)((long)ida_mem + 0x1e0));
    *jcur = 1;
    *(undefined8 *)((long)ida_mem + 0x2c8) = *(undefined8 *)((long)ida_mem + 0x2b8);
    *(undefined8 *)((long)ida_mem + 0x2d0) = 0x3ff0000000000000;
    *(undefined8 *)((long)ida_mem + 0x2d8) = 0x4034000000000000;
    if (iVar1 < 0) {
      iVar1 = -6;
    }
    else {
      iVar1 = (uint)(iVar1 != 0) * 2;
    }
  }
  return iVar1;
}

Assistant:

static int idaNlsLSetup(SUNDIALS_MAYBE_UNUSED sunbooleantype jbad,
                        sunbooleantype* jcur, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  IDA_mem->ida_nsetups++;
  retval = IDA_mem->ida_lsetup(IDA_mem, IDA_mem->ida_yy, IDA_mem->ida_yp,
                               IDA_mem->ida_savres, IDA_mem->ida_tempv1,
                               IDA_mem->ida_tempv2, IDA_mem->ida_tempv3);

  /* update Jacobian status */
  *jcur = SUNTRUE;

  /* update convergence test constants */
  IDA_mem->ida_cjold   = IDA_mem->ida_cj;
  IDA_mem->ida_cjratio = ONE;
  IDA_mem->ida_ss      = TWENTY;

  if (retval < 0) { return (IDA_LSETUP_FAIL); }
  if (retval > 0) { return (IDA_LSETUP_RECVR); }

  return (IDA_SUCCESS);
}